

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

FilterInfo * __thiscall
helics::FilterFederate::getFilterInfo
          (FilterFederate *this,GlobalFederateId fed,InterfaceHandle handle)

{
  bool bVar1;
  FilterInfo *pFVar2;
  InterfaceHandle in_EDX;
  BaseType in_ESI;
  BaseType *in_RDI;
  GlobalHandle in_stack_ffffffffffffffe0;
  GlobalBrokerId in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  GlobalFederateId local_4;
  
  uVar3 = 0;
  local_4.gid = in_ESI;
  bVar1 = GlobalFederateId::operator==(&local_4,(GlobalBrokerId)0x0);
  if (!bVar1) {
    in_stack_ffffffffffffffe8.gid = in_RDI[1];
    bVar1 = GlobalFederateId::operator==(&local_4,in_stack_ffffffffffffffe8);
    if (!bVar1) goto LAB_00643192;
  }
  local_4.gid = *in_RDI;
LAB_00643192:
  GlobalHandle::GlobalHandle((GlobalHandle *)&stack0xffffffffffffffe0,local_4,in_EDX);
  pFVar2 = gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::find
                     ((MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *)
                      CONCAT44(uVar3,in_stack_ffffffffffffffe8.gid),
                      (GlobalHandle *)in_stack_ffffffffffffffe0);
  return pFVar2;
}

Assistant:

FilterInfo* FilterFederate::getFilterInfo(GlobalFederateId fed, InterfaceHandle handle)
{
    if (fed == parent_broker_id || fed == mCoreID) {
        fed = mFedID;
    }
    return filters.find(GlobalHandle{fed, handle});
}